

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O1

optional<unsigned_long> __thiscall bloaty::dwarf::AttrValue::ToUint(AttrValue *this,CU *cu)

{
  _Storage<unsigned_long,_true> in_RAX;
  ulong uVar1;
  _Storage<unsigned_long,_true> *p_Var2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  string_view sVar4;
  optional<unsigned_long> oVar5;
  
  if (this->form_ == 0x21) {
switchD_001b03f1_default:
    uVar3 = 0;
  }
  else {
    if ((this->type_ & ~kUnresolvedUint) == kUint) {
      in_RAX._M_value = GetUint(this,cu);
      uVar3 = extraout_RDX;
    }
    else {
      sVar4 = GetString(this,cu);
      p_Var2 = (_Storage<unsigned_long,_true> *)sVar4._M_str;
      uVar1 = sVar4._M_len;
      uVar3 = 0;
      in_RAX._M_value = uVar1 - 1;
      switch(in_RAX._M_value) {
      case 0:
      case 1:
        in_RAX._M_value._1_7_ = 0;
        in_RAX._M_value._0_1_ = *(byte *)p_Var2;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
        goto switchD_001b03f1_caseD_2;
      case 3:
        if (uVar1 < 4) {
LAB_001b0417:
          Throw("premature EOF reading fixed-length data",0x8d);
        }
        in_RAX._M_value._4_4_ = 0;
        in_RAX._M_value._0_4_ = *(uint *)p_Var2;
        break;
      case 7:
        if (uVar1 < 8) goto LAB_001b0417;
        in_RAX = (_Storage<unsigned_long,_true>)p_Var2->_M_value;
        break;
      default:
        goto switchD_001b03f1_default;
      }
    }
    uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
  }
switchD_001b03f1_caseD_2:
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RAX._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

absl::optional<uint64_t> AttrValue::ToUint(const CU& cu) const {
  if (form_ == DW_FORM_implicit_const) {
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // return absl::nullopt to make sure the value is not available.
    return absl::nullopt;
  }
  if (IsUint()) return GetUint(cu);
  string_view str = GetString(cu);
  switch (str.size()) {
    case 1:
      return ReadFixed<uint8_t>(&str);
    case 2:
      return ReadFixed<uint8_t>(&str);
    case 4:
      return ReadFixed<uint32_t>(&str);
    case 8:
      return ReadFixed<uint64_t>(&str);
  }
  return absl::nullopt;
}